

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

void __thiscall GraphBuilder::printNodes(GraphBuilder *this,ostream *ostream)

{
  __node_base *p_Var1;
  __node_base *p_Var2;
  string local_40;
  
  p_Var1 = &(this->llvmToNodeMap_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    Node::dump_abi_cxx11_
              (&local_40,*(Node **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor);
    std::operator<<(ostream,(string *)&local_40);
    std::__cxx11::string::_M_dispose();
  }
  p_Var2 = &(this->artificialNodes_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    Node::dump_abi_cxx11_(&local_40,(Node *)p_Var2[1]._M_nxt);
    std::operator<<(ostream,(string *)&local_40);
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void GraphBuilder::printNodes(std::ostream &ostream) const {
    for (const auto &iterator : llvmToNodeMap_) {
        ostream << iterator.second->dump();
    }
    for (const auto &iterator : artificialNodes_) {
        ostream << iterator->dump();
    }
}